

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerMixin.cpp
# Opt level: O0

TimerId __thiscall Liby::TimerMixin::runHelper(TimerMixin *this,TimerHolder *timerHolder)

{
  TimerId that;
  Timer *this_00;
  mapped_type *this_01;
  uint64_t local_20;
  TimerId id;
  TimerHolder *timerHolder_local;
  TimerMixin *this_local;
  
  id = (TimerId)timerHolder;
  timerHolder_local = (TimerHolder *)this;
  this_00 = TimerHolder::getTimer(timerHolder);
  local_20 = Timer::id(this_00);
  that = id;
  this_01 = std::
            unordered_map<unsigned_long,_Liby::TimerHolder,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_Liby::TimerHolder>_>_>
            ::operator[](&this->timerHolders_,&local_20);
  TimerHolder::operator=(this_01,(TimerHolder *)that);
  return local_20;
}

Assistant:

TimerId TimerMixin::runHelper(TimerHolder &&timerHolder) {
    TimerId id = timerHolder.getTimer().id();
    timerHolders_[id] = timerHolder;
    return id;
}